

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000199040 = 0x2e2e2e2e2e2e2e;
    uRam0000000000199047._0_1_ = '.';
    uRam0000000000199047._1_1_ = '.';
    uRam0000000000199047._2_1_ = '.';
    uRam0000000000199047._3_1_ = '.';
    uRam0000000000199047._4_1_ = '.';
    uRam0000000000199047._5_1_ = '.';
    uRam0000000000199047._6_1_ = '.';
    uRam0000000000199047._7_1_ = '.';
    DAT_00199030 = '.';
    DAT_00199030_1._0_1_ = '.';
    DAT_00199030_1._1_1_ = '.';
    DAT_00199030_1._2_1_ = '.';
    DAT_00199030_1._3_1_ = '.';
    DAT_00199030_1._4_1_ = '.';
    DAT_00199030_1._5_1_ = '.';
    DAT_00199030_1._6_1_ = '.';
    uRam0000000000199038 = 0x2e2e2e2e2e2e2e;
    DAT_0019903f = 0x2e;
    DAT_00199020 = '.';
    DAT_00199020_1._0_1_ = '.';
    DAT_00199020_1._1_1_ = '.';
    DAT_00199020_1._2_1_ = '.';
    DAT_00199020_1._3_1_ = '.';
    DAT_00199020_1._4_1_ = '.';
    DAT_00199020_1._5_1_ = '.';
    DAT_00199020_1._6_1_ = '.';
    uRam0000000000199028._0_1_ = '.';
    uRam0000000000199028._1_1_ = '.';
    uRam0000000000199028._2_1_ = '.';
    uRam0000000000199028._3_1_ = '.';
    uRam0000000000199028._4_1_ = '.';
    uRam0000000000199028._5_1_ = '.';
    uRam0000000000199028._6_1_ = '.';
    uRam0000000000199028._7_1_ = '.';
    DAT_00199010 = '.';
    DAT_00199010_1._0_1_ = '.';
    DAT_00199010_1._1_1_ = '.';
    DAT_00199010_1._2_1_ = '.';
    DAT_00199010_1._3_1_ = '.';
    DAT_00199010_1._4_1_ = '.';
    DAT_00199010_1._5_1_ = '.';
    DAT_00199010_1._6_1_ = '.';
    uRam0000000000199018._0_1_ = '.';
    uRam0000000000199018._1_1_ = '.';
    uRam0000000000199018._2_1_ = '.';
    uRam0000000000199018._3_1_ = '.';
    uRam0000000000199018._4_1_ = '.';
    uRam0000000000199018._5_1_ = '.';
    uRam0000000000199018._6_1_ = '.';
    uRam0000000000199018._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000199008._0_1_ = '.';
    uRam0000000000199008._1_1_ = '.';
    uRam0000000000199008._2_1_ = '.';
    uRam0000000000199008._3_1_ = '.';
    uRam0000000000199008._4_1_ = '.';
    uRam0000000000199008._5_1_ = '.';
    uRam0000000000199008._6_1_ = '.';
    uRam0000000000199008._7_1_ = '.';
    DAT_0019904f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}